

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::DescriptorProto_ExtensionRange::_InternalParse
          (DescriptorProto_ExtensionRange *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  byte bVar2;
  ExtensionRangeOptions *msg;
  char cVar3;
  uint32 res;
  uint tag;
  uint uVar4;
  uint uVar5;
  Arena *arena;
  byte *ptr_00;
  pair<const_char_*,_unsigned_int> pVar6;
  pair<const_char_*,_unsigned_long> pVar7;
  pair<const_char_*,_bool> pVar8;
  
  uVar4 = 0;
LAB_00170e73:
  do {
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ ==
          (long)(ctx->super_EpsCopyInputStream).limit_) goto LAB_00171000;
      pVar8 = internal::EpsCopyInputStream::DoneFallback
                        (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      ptr = pVar8.first;
      if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
      goto LAB_00171000;
    }
    bVar1 = *ptr;
    pVar6.second._0_1_ = bVar1;
    pVar6.first = (char *)((byte *)ptr + 1);
    pVar6._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = ((byte *)ptr)[1];
      res = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar6 = internal::ReadTagFallback(ptr,res);
        if (pVar6.first == (char *)0x0) goto LAB_0017100f;
      }
      else {
        pVar6.second = res;
        pVar6.first = (char *)((byte *)ptr + 2);
        pVar6._12_4_ = 0;
      }
    }
    ptr_00 = (byte *)pVar6.first;
    tag = pVar6.second;
    uVar5 = (uint)(pVar6._8_8_ >> 3) & 0x1fffffff;
    cVar3 = (char)pVar6.second;
    if (uVar5 == 3) {
      if (cVar3 != '\x1a') goto LAB_00170f80;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      msg = this->options_;
      if (msg == (ExtensionRangeOptions *)0x0) {
        arena = (Arena *)(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         .ptr_;
        if (((ulong)arena & 1) != 0) {
          arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
        }
        msg = Arena::CreateMaybeMessage<google::protobuf::ExtensionRangeOptions>(arena);
        this->options_ = msg;
      }
      ptr = internal::ParseContext::ParseMessage<google::protobuf::ExtensionRangeOptions>
                      (ctx,msg,(char *)ptr_00);
    }
    else {
      if (uVar5 == 2) {
        if (cVar3 == '\x10') {
          uVar4 = uVar4 | 4;
          bVar1 = *ptr_00;
          uVar5 = (uint)bVar1;
          ptr = (char *)(ptr_00 + 1);
          if ((char)bVar1 < '\0') {
            uVar5 = ((uint)bVar1 + (uint)(byte)*ptr * 0x80) - 0x80;
            if (*ptr < '\0') {
              pVar7 = internal::VarintParseSlow64((char *)ptr_00,uVar5);
              ptr = pVar7.first;
              this->end_ = (int32)pVar7.second;
              goto LAB_00170f9e;
            }
            ptr = (char *)(ptr_00 + 2);
          }
          this->end_ = uVar5;
          goto LAB_00170e73;
        }
      }
      else if ((uVar5 == 1) && (cVar3 == '\b')) {
        uVar4 = uVar4 | 2;
        bVar1 = *ptr_00;
        uVar5 = (uint)bVar1;
        ptr = (char *)(ptr_00 + 1);
        if ((char)bVar1 < '\0') {
          uVar5 = ((uint)bVar1 + (uint)(byte)*ptr * 0x80) - 0x80;
          if (*ptr < '\0') {
            pVar7 = internal::VarintParseSlow64((char *)ptr_00,uVar5);
            ptr = pVar7.first;
            this->start_ = (int32)pVar7.second;
            goto LAB_00170f9e;
          }
          ptr = (char *)(ptr_00 + 2);
        }
        this->start_ = uVar5;
        goto LAB_00170e73;
      }
LAB_00170f80:
      if ((tag == 0) || ((tag & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
        ptr = (char *)ptr_00;
        goto LAB_00171000;
      }
      ptr = internal::UnknownFieldParse(tag,&this->_internal_metadata_,(char *)ptr_00,ctx);
    }
LAB_00170f9e:
    if ((byte *)ptr == (byte *)0x0) {
LAB_0017100f:
      ptr = (char *)(byte *)0x0;
LAB_00171000:
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar4;
      return (char *)(byte *)ptr;
    }
  } while( true );
}

Assistant:

const char* DescriptorProto_ExtensionRange::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional int32 start = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8)) {
          _Internal::set_has_start(&has_bits);
          start_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional int32 end = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          _Internal::set_has_end(&has_bits);
          end_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.ExtensionRangeOptions options = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}